

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void duckdb::BaseStatistics::Construct(BaseStatistics *stats,LogicalType *type)

{
  StatisticsType SVar1;
  
  stats->distinct_count = 0;
  LogicalType::operator=(&stats->type,type);
  SVar1 = GetStatsType(&stats->type);
  if (SVar1 == ARRAY_STATS) {
    ArrayStats::Construct(stats);
    return;
  }
  if (SVar1 != STRUCT_STATS) {
    if (SVar1 == LIST_STATS) {
      ListStats::Construct(stats);
      return;
    }
    return;
  }
  StructStats::Construct(stats);
  return;
}

Assistant:

void BaseStatistics::Construct(BaseStatistics &stats, LogicalType type) {
	stats.distinct_count = 0;
	stats.type = std::move(type);
	switch (GetStatsType(stats.type)) {
	case StatisticsType::LIST_STATS:
		ListStats::Construct(stats);
		break;
	case StatisticsType::STRUCT_STATS:
		StructStats::Construct(stats);
		break;
	case StatisticsType::ARRAY_STATS:
		ArrayStats::Construct(stats);
		break;
	default:
		break;
	}
}